

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

void des3_set3key(uint32_t *esk,uint32_t *dsk,uchar *key)

{
  int local_24;
  int i;
  uchar *key_local;
  uint32_t *dsk_local;
  uint32_t *esk_local;
  
  mbedtls_des_setkey(esk,key);
  mbedtls_des_setkey(dsk + 0x20,key + 8);
  mbedtls_des_setkey(esk + 0x40,key + 0x10);
  for (local_24 = 0; local_24 < 0x20; local_24 = local_24 + 2) {
    dsk[local_24] = esk[0x5e - local_24];
    dsk[local_24 + 1] = esk[0x5f - local_24];
    esk[local_24 + 0x20] = dsk[0x3e - local_24];
    esk[local_24 + 0x21] = dsk[0x3f - local_24];
    dsk[local_24 + 0x40] = esk[0x1e - local_24];
    dsk[local_24 + 0x41] = esk[0x1f - local_24];
  }
  return;
}

Assistant:

static void des3_set3key( uint32_t esk[96],
                          uint32_t dsk[96],
                          const unsigned char key[24] )
{
    int i;

    mbedtls_des_setkey( esk, key );
    mbedtls_des_setkey( dsk + 32, key +  8 );
    mbedtls_des_setkey( esk + 64, key + 16 );

    for( i = 0; i < 32; i += 2 )
    {
        dsk[i     ] = esk[94 - i];
        dsk[i +  1] = esk[95 - i];

        esk[i + 32] = dsk[62 - i];
        esk[i + 33] = dsk[63 - i];

        dsk[i + 64] = esk[30 - i];
        dsk[i + 65] = esk[31 - i];
    }
}